

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackLog.cxx
# Opt level: O0

bool __thiscall cmCPackLog::SetLogOutputFile(cmCPackLog *this,char *fname)

{
  ulong uVar1;
  cmGeneratedFileStream *local_28;
  cmGeneratedFileStream *cg;
  char *fname_local;
  cmCPackLog *this_local;
  
  local_28 = (cmGeneratedFileStream *)0x0;
  if (fname != (char *)0x0) {
    local_28 = (cmGeneratedFileStream *)operator_new(0x248);
    cmGeneratedFileStream::cmGeneratedFileStream(local_28,fname,false);
  }
  if ((local_28 != (cmGeneratedFileStream *)0x0) &&
     (uVar1 = std::ios::operator!((ios *)((long)&(local_28->super_ofstream).
                                                 super_basic_ostream<char,_std::char_traits<char>_>.
                                                 _vptr_basic_ostream +
                                         (long)(local_28->super_ofstream).
                                               super_basic_ostream<char,_std::char_traits<char>_>.
                                               _vptr_basic_ostream[-3])), (uVar1 & 1) != 0)) {
    if (local_28 != (cmGeneratedFileStream *)0x0) {
      (*(local_28->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
        _vptr_basic_ostream[1])();
    }
    local_28 = (cmGeneratedFileStream *)0x0;
  }
  SetLogOutputStream(this,(ostream *)local_28);
  if (local_28 != (cmGeneratedFileStream *)0x0) {
    this->LogOutputCleanup = true;
  }
  return local_28 != (cmGeneratedFileStream *)0x0;
}

Assistant:

bool cmCPackLog::SetLogOutputFile(const char* fname)
{
  cmGeneratedFileStream *cg = 0;
  if ( fname )
    {
    cg = new cmGeneratedFileStream(fname);
    }
  if ( cg && !*cg )
    {
    delete cg;
    cg = 0;
    }
  this->SetLogOutputStream(cg);
  if ( !cg )
    {
    return false;
    }
  this->LogOutputCleanup = true;
  return true;
}